

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::HairMaterial::ToString_abi_cxx11_(string *__return_storage_ptr__,HairMaterial *this)

{
  FloatTextureHandle *in_RAX;
  
  StringPrintf<pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ HairMaterial sigma_a: %s color: %s eumelanin: %s pheomelanin: %s eta: %s beta_m: %s beta_n: %s alpha: %s ]"
             ,(char *)this,&this->color,(SpectrumTextureHandle *)&this->eumelanin,&this->pheomelanin
             ,&this->eta,&this->beta_m,&this->beta_n,&this->alpha,in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string HairMaterial::ToString() const {
    return StringPrintf("[ HairMaterial sigma_a: %s color: %s eumelanin: %s "
                        "pheomelanin: %s eta: %s beta_m: %s beta_n: %s alpha: %s ]",
                        sigma_a, color, eumelanin, pheomelanin, eta, beta_m, beta_n,
                        alpha);
}